

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newstate(lua_Alloc f,void *ud,uint seed)

{
  l_uint32 *plVar1;
  lu_byte lVar2;
  TStatus TVar3;
  global_State *g;
  lua_State *L;
  long lVar4;
  
  L = (lua_State *)0x0;
  g = (global_State *)(*f)(ud,(void *)0x0,8,0x658);
  if (g != (global_State *)0x0) {
    L = &(g->mainth).l;
    (g->mainth).l.tt = '\b';
    (g->mainth).l.marked = '\b';
    g->currentwhite = '\b';
    preinit_thread(L,g);
    g->allgc = (GCObject *)L;
    (g->mainth).l.next = (GCObject *)0x0;
    plVar1 = &(g->mainth).l.nCcalls;
    *plVar1 = *plVar1 + 0x10000;
    g->frealloc = f;
    g->ud = ud;
    g->warnf = (lua_WarnFunction)0x0;
    g->ud_warn = (void *)0x0;
    g->seed = seed;
    (g->l_registry).tt_ = '\0';
    g->panic = (lua_CFunction)0x0;
    (g->strt).hash = (TString **)0x0;
    (g->strt).nuse = 0;
    (g->strt).size = 0;
    g->gcstate = '\b';
    g->gckind = '\0';
    g->gcstopem = '\0';
    g->gcstp = '\x02';
    g->gcemergency = '\0';
    memset(&g->sweepgc,0,0x88);
    g->GCtotalbytes = 0x658;
    (g->nilvalue).value_.gc = (GCObject *)0x0;
    g->GCdebt = 0;
    g->GCmarked = 0;
    (g->nilvalue).tt_ = '\x03';
    lVar2 = luaO_codeparam(0xfa);
    g->gcparams[3] = lVar2;
    lVar2 = luaO_codeparam(200);
    g->gcparams[4] = lVar2;
    lVar2 = luaO_codeparam(0x2580);
    g->gcparams[5] = lVar2;
    lVar2 = luaO_codeparam(0x14);
    g->gcparams[0] = lVar2;
    lVar2 = luaO_codeparam(0x46);
    g->gcparams[2] = lVar2;
    lVar2 = luaO_codeparam(0x32);
    g->gcparams[1] = lVar2;
    for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
      g->mt[lVar4] = (Table *)0x0;
    }
    TVar3 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (TVar3 != '\0') {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud, unsigned seed) {
  int i;
  lua_State *L;
  global_State *g = cast(global_State*,
                       (*f)(ud, NULL, LUA_TTHREAD, sizeof(global_State)));
  if (g == NULL) return NULL;
  L = &g->mainth.l;
  L->tt = LUA_VTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  incnny(L);  /* main thread is always non yieldable */
  g->frealloc = f;
  g->ud = ud;
  g->warnf = NULL;
  g->ud_warn = NULL;
  g->seed = seed;
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->GCtotalbytes = sizeof(global_State);
  g->GCmarked = 0;
  g->GCdebt = 0;
  setivalue(&g->nilvalue, 0);  /* to signal that state is not yet built */
  setgcparam(g, PAUSE, LUAI_GCPAUSE);
  setgcparam(g, STEPMUL, LUAI_GCMUL);
  setgcparam(g, STEPSIZE, LUAI_GCSTEPSIZE);
  setgcparam(g, MINORMUL, LUAI_GENMINORMUL);
  setgcparam(g, MINORMAJOR, LUAI_MINORMAJOR);
  setgcparam(g, MAJORMINOR, LUAI_MAJORMINOR);
  for (i=0; i < LUA_NUMTYPES; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}